

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1d_cbs.c
# Opt level: O0

RK_S32 mpp_av1_read_increment
                 (BitReadCtx_t *gbc,RK_U32 range_min,RK_U32 range_max,char *name,RK_U32 *write_to)

{
  RK_S32 RVar1;
  MPP_RET MVar2;
  RK_S32 local_70;
  undefined1 local_69;
  RK_S32 _out;
  RK_U8 tmp;
  RK_S8 bits [33];
  int local_38;
  uint local_34;
  RK_S32 i;
  RK_U32 value;
  RK_U32 *write_to_local;
  char *name_local;
  RK_U32 range_max_local;
  RK_U32 range_min_local;
  BitReadCtx_t *gbc_local;
  
  if (((range_max < range_min) || (0x1f < range_max - range_min)) &&
     (_mpp_log_l(2,"av1d_cbs","Assertion %s failed at %s:%d\n",(char *)0x0,
                 "range_min <= range_max && range_max - range_min < sizeof(bits) - 1",
                 "mpp_av1_read_increment",0x90), (mpp_debug & 0x10000000) != 0)) {
    abort();
  }
  local_38 = 0;
  local_34 = range_min;
  do {
    if (range_max <= local_34) {
LAB_0021915c:
      *write_to = local_34;
      return 0;
    }
    local_69 = 0;
    RVar1 = mpp_get_bits_left(gbc);
    if (RVar1 < 1) {
      _mpp_log_l(2,"av1d_cbs","Invalid increment value at %s: bitstream ended.\n",
                 "mpp_av1_read_increment",name);
      return -1;
    }
    MVar2 = mpp_read_bits(gbc,1,&local_70);
    gbc->ret = MVar2;
    if (gbc->ret != MPP_OK) {
      return -1;
    }
    if ((char)local_70 == '\0') {
      *(undefined1 *)((long)&_out + (long)local_38) = 0x30;
      goto LAB_0021915c;
    }
    *(undefined1 *)((long)&_out + (long)local_38) = 0x31;
    local_34 = local_34 + 1;
    local_38 = local_38 + 1;
  } while( true );
}

Assistant:

static RK_S32 mpp_av1_read_increment(BitReadCtx_t *gbc, RK_U32 range_min,
                                     RK_U32 range_max, const char *name,
                                     RK_U32 *write_to)
{
    RK_U32 value;
    RK_S32 i;
    RK_S8 bits[33];

    mpp_assert(range_min <= range_max && range_max - range_min < sizeof(bits) - 1);

    for (i = 0, value = range_min; value < range_max;) {
        RK_U8 tmp = 0;
        if (mpp_get_bits_left(gbc) < 1) {
            mpp_err_f("Invalid increment value at "
                      "%s: bitstream ended.\n", name);
            return MPP_NOK;
        }
        READ_ONEBIT(gbc, &tmp);
        if (tmp) {
            bits[i++] = '1';
            ++value;
        } else {
            bits[i++] = '0';
            break;
        }
    }
    *write_to = value;
    return MPP_OK;

__bitread_error:
    return MPP_NOK;
}